

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O0

void __thiscall
agge::tests::mocks::font_accessor::font_accessor<1ul,2ul>
          (font_accessor *this,font_metrics *metrics_,char_to_index (*indices) [1],
          glyph (*glyphs) [2])

{
  glyph_index_t gVar1;
  glyph *__first;
  bool bVar2;
  unsigned_long *__p;
  glyph *__last;
  element_type *peVar3;
  allocator<agge::tests::mocks::font_accessor::glyph> local_35 [13];
  glyph *local_28;
  glyph (*glyphs_local) [2];
  char_to_index (*indices_local) [1];
  font_metrics *metrics__local;
  font_accessor *this_local;
  
  local_28 = *glyphs;
  glyphs_local = (glyph (*) [2])indices;
  indices_local = (char_to_index (*) [1])metrics_;
  metrics__local = (font_metrics *)this;
  font::accessor::accessor(&this->super_accessor);
  (this->super_accessor)._vptr_accessor = (_func_int **)&PTR_get_descriptor_00314578;
  this->glyph_mapping_calls = 0;
  __p = (unsigned_long *)operator_new(8);
  *__p = 0;
  std::shared_ptr<unsigned_long>::shared_ptr<unsigned_long,void>(&this->glyphs_loaded,__p);
  font_descriptor::font_descriptor(&this->descriptor);
  (this->_metrics).leading = (real_t)indices_local[1][0].symbol;
  gVar1 = indices_local[0][0].index;
  (this->_metrics).ascent = (real_t)indices_local[0][0].symbol;
  (this->_metrics).descent = (real_t)gVar1;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::map<agge::tests::mocks::font_accessor::char_to_index_const*>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&this->_indices,(char_to_index *)glyphs_local,
             (char_to_index *)&(*glyphs_local)[0].metrics.dy);
  __first = local_28;
  __last = local_28 + 2;
  std::allocator<agge::tests::mocks::font_accessor::glyph>::allocator(local_35);
  std::
  vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
  ::vector<agge::tests::mocks::font_accessor::glyph*,void>
            ((vector<agge::tests::mocks::font_accessor::glyph,std::allocator<agge::tests::mocks::font_accessor::glyph>>
              *)&this->_glyphs,__first,__last,local_35);
  std::allocator<agge::tests::mocks::font_accessor::glyph>::~allocator(local_35);
  std::shared_ptr<unsigned_long>::shared_ptr(&this->_allocated);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_allocated);
  if (bVar2) {
    peVar3 = std::__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->_allocated);
    *peVar3 = *peVar3 + 1;
  }
  return;
}

Assistant:

inline font_accessor::font_accessor(const font_metrics &metrics_, const char_to_index (&indices)[indices_n],
					glyph (&glyphs)[glyphs_n])
				: glyph_mapping_calls(0), glyphs_loaded(new size_t(0)), _metrics(metrics_),
					_indices(indices, indices + indices_n), _glyphs(glyphs, glyphs + glyphs_n)/*,
					_allocated(allocated)*/
			{
				if (_allocated)
					++*_allocated;
			}